

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O3

void * boost::(anonymous_namespace)::thread_proxy(void *param)

{
  int iVar1;
  mutex *this;
  thread_data_ptr thread_info;
  enable_shared_from_this<boost::detail::thread_data_base> local_38;
  undefined1 local_28 [8];
  shared_count asStack_20 [2];
  
  enable_shared_from_this<boost::detail::thread_data_base>::shared_from_this(&local_38);
  if (local_38.weak_this_.px != (thread_data_base *)0x0) {
    local_28 = (undefined1  [8])((local_38.weak_this_.px)->self).px;
    asStack_20[0].pi_ = ((local_38.weak_this_.px)->self).pn.pi_;
    ((local_38.weak_this_.px)->self).px = (element_type *)0x0;
    ((local_38.weak_this_.px)->self).pn.pi_ = (sp_counted_base *)0x0;
    detail::shared_count::~shared_count(asStack_20);
    detail::set_current_thread_data(local_38.weak_this_.px);
    if (local_38.weak_this_.px != (thread_data_base *)0x0) {
      (*(local_38.weak_this_.px)->_vptr_thread_data_base[2])();
      detail::(anonymous_namespace)::tls_destructor(local_38.weak_this_.px);
      detail::set_current_thread_data((thread_data_base *)0x0);
      if (local_38.weak_this_.px != (thread_data_base *)0x0) {
        this = &(local_38.weak_this_.px)->data_mutex;
        mutex::lock(this);
        if (local_38.weak_this_.px != (thread_data_base *)0x0) {
          (local_38.weak_this_.px)->done = true;
          pthread::pthread_mutex_scoped_lock::pthread_mutex_scoped_lock
                    ((pthread_mutex_scoped_lock *)local_28,
                     &((local_38.weak_this_.px)->done_condition).internal_mutex);
          iVar1 = pthread_cond_broadcast
                            ((pthread_cond_t *)&((local_38.weak_this_.px)->done_condition).cond);
          if (iVar1 == 0) {
            if (asStack_20[0].pi_._0_1_ == true) {
              pthread::pthread_mutex_scoped_lock::unlock((pthread_mutex_scoped_lock *)local_28);
            }
            mutex::unlock(this);
            detail::shared_count::~shared_count((shared_count *)&local_38.weak_this_.pn);
            return (void *)0x0;
          }
          __assert_fail("!pthread_cond_broadcast(&cond)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/thread/pthread/condition_variable.hpp"
                        ,0x96,"void boost::condition_variable::notify_all()");
        }
      }
    }
  }
  __assert_fail("px != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                ,0x2de,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::detail::thread_data_base>::operator->() const [T = boost::detail::thread_data_base]"
               );
}

Assistant:

static void* thread_proxy(void* param)
            {
                //boost::detail::thread_data_ptr thread_info = static_cast<boost::detail::thread_data_base*>(param)->self;
                boost::detail::thread_data_ptr thread_info = static_cast<boost::detail::thread_data_base*>(param)->shared_from_this();
                thread_info->self.reset();
                detail::set_current_thread_data(thread_info.get());
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
                BOOST_TRY
                {
#endif
                    thread_info->run();
#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS

                }
                BOOST_CATCH (thread_interrupted const&)
                {
                }
// Removed as it stops the debugger identifying the cause of the exception
// Unhandled exceptions still cause the application to terminate
//                 BOOST_CATCH(...)
//                 {
//                   throw;
//
//                     std::terminate();
//                 }
                BOOST_CATCH_END
#endif
                detail::tls_destructor(thread_info.get());
                detail::set_current_thread_data(0);
                boost::lock_guard<boost::mutex> lock(thread_info->data_mutex);
                thread_info->done=true;
                thread_info->done_condition.notify_all();

                return 0;
            }